

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O2

void __thiscall
fm_ns_local_search::compute_gain
          (fm_ns_local_search *this,AdjList *G,NodeID node,Gain *toLHS,Gain *toRHS)

{
  int iVar1;
  pointer pvVar2;
  int *piVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  int *piVar6;
  Gain *pGVar7;
  
  *toLHS = 1;
  *toRHS = 1;
  pvVar2 = (G->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar3 = *(pointer *)
            ((long)&pvVar2[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  pvVar4 = this->partition_index;
  pvVar5 = this->x;
  for (piVar6 = pvVar2[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar6 != piVar3; piVar6 = piVar6 + 1) {
    if (((pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start[*piVar6] < 0) &&
       ((iVar1 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[*piVar6], pGVar7 = toRHS, iVar1 == 0 ||
        (pGVar7 = toLHS, iVar1 == 1)))) {
      *pGVar7 = *pGVar7 + -1;
    }
  }
  return;
}

Assistant:

inline
void fm_ns_local_search::compute_gain( AdjList & G, NodeID node, Gain & toLHS, Gain & toRHS) {
        toLHS = 1;
        toRHS = 1;

        for (int neighbor : G[node])
        {
                if (x[neighbor] < 0) {
                        int part_ind = partition_index[neighbor];
                        if (part_ind == 0) {
                                toRHS -= 1;
                        } else if (part_ind == 1) {
                                toLHS -= 1;
                        }
                }
        }
}